

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilPath.c
# Opt level: O2

void Abc_GraphPathPrint5(int *pBuffer,Vec_Int_t *vEdges)

{
  int iVar1;
  ulong uVar2;
  undefined1 uVar3;
  uint uVar4;
  int *piVar5;
  uint uVar6;
  char (*pacVar7) [17];
  uint uVar8;
  long lVar9;
  char *pcVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  char (*pacVar14) [17];
  ulong uVar15;
  char Box [17] [17];
  
  pacVar7 = Box;
  pacVar14 = Box;
  iVar1 = vEdges->nSize;
  for (lVar9 = 0; lVar9 != 0x11; lVar9 = lVar9 + 1) {
    for (lVar12 = 0; lVar12 != 0x11; lVar12 = lVar12 + 1) {
      uVar3 = 0x2a;
      if ((((uint)lVar12 | (uint)lVar9) & 3) != 0) {
        uVar3 = 0x20;
      }
      *(undefined1 *)((long)pacVar7 + lVar12) = uVar3;
    }
    pacVar7 = (char (*) [17])((long)pacVar7 + 0x11);
  }
  uVar2 = (long)iVar1 / 2;
  uVar13 = 0;
  uVar15 = uVar2 & 0xffffffff;
  if ((int)uVar2 < 1) {
    uVar15 = uVar13;
  }
  do {
    if (uVar13 == uVar15) {
      for (lVar9 = 0; lVar9 != 0x11; lVar9 = lVar9 + 1) {
        for (lVar12 = 0; lVar12 != 0x11; lVar12 = lVar12 + 1) {
          putchar((int)*(char *)((long)pacVar14 + lVar12));
        }
        putchar(10);
        pacVar14 = (char (*) [17])((long)pacVar14 + 0x11);
      }
      puts("\n\n=================================\n");
      return;
    }
    piVar5 = Vec_IntEntryP(vEdges,(int)uVar13 * 2);
    if (pBuffer[uVar13] != 0) {
      uVar11 = *piVar5 / 5 << 2;
      uVar6 = *piVar5 % 5 << 2;
      uVar4 = (piVar5[1] / 5) * 4;
      uVar8 = (piVar5[1] % 5) * 4;
      if (uVar11 == uVar4) {
        for (lVar9 = (long)(int)(uVar6 | 1); lVar9 < (int)uVar8; lVar9 = lVar9 + 1) {
          Box[(int)uVar11][lVar9] = '-';
        }
      }
      else {
        if (uVar6 != uVar8) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilPath.c"
                        ,0xf7,"void Abc_GraphPathPrint5(int *, Vec_Int_t *)");
        }
        pcVar10 = Box[(long)(int)uVar11 + 1] + (int)uVar6;
        for (lVar9 = (long)(int)(uVar11 | 1); lVar9 < (int)uVar4; lVar9 = lVar9 + 1) {
          *pcVar10 = '|';
          pcVar10 = pcVar10 + 0x11;
        }
      }
    }
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

void Abc_GraphPathPrint5( int * pBuffer, Vec_Int_t * vEdges )
{
    char Box[17][17];
    int x, y;
    int e, nEdges = Vec_IntSize(vEdges)/2;
    for ( y = 0; y < 17; y++ )
    for ( x = 0; x < 17; x++ )
        if ( y % 4 == 0 && x % 4 == 0 )
            Box[y][x] = '*';
        else
            Box[y][x] = ' ';
    for ( e = 0; e < nEdges; e++ )
    {
        int * pNodes = Vec_IntEntryP(vEdges, 2*e);
        int y0 = 4*(pNodes[0]/5);
        int x0 = 4*(pNodes[0]%5);
        int y1 = 4*(pNodes[1]/5);
        int x1 = 4*(pNodes[1]%5);
        if ( !pBuffer[e] )
            continue;
        if ( y0 == y1 )
        {
            for ( x = x0+1; x < x1; x++ )
                Box[y0][x] = '-';
        }
        else if ( x0 == x1 )
        {
            for ( y = y0+1; y < y1; y++ )
                Box[y][x0] = '|';
        }
        else assert( 0 );
    }
    for ( y = 0; y < 17; y++, printf("\n") )
    for ( x = 0; x < 17; x++ )
        printf( "%c", Box[y][x] );
    printf( "\n\n=================================\n\n" );
}